

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall
lr_grammar::GrammarLR::update_elem
          (GrammarLR *this,int elemIndex,int begin,int end,
          vector<int,_std::allocator<int>_> *factory)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> *this_00;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int i;
  pointer pEVar10;
  long lVar11;
  int newIndex;
  vector<int,_std::allocator<int>_> *local_258;
  int local_24c;
  long local_248;
  long local_240;
  vector<int,_std::allocator<int>_> t;
  int local_20c;
  _Vector_base<int,_std::allocator<int>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  _Vector_base<int,_std::allocator<int>_> local_1d0;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  local_258 = factory;
  local_24c = begin;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  pEVar10 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1f0,&pEVar10[elemIndex].super_Elem.name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
  local_240 = CONCAT44(local_240._4_4_,end);
  iVar2 = add_elem(this,&local_1f0,false);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&t);
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  pEVar10 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)local_24c;
  lVar6 = *(long *)&pEVar10[elemIndex].expression_of_set.
                    super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                    ._M_impl.super__Vector_impl_data;
  lVar7 = lVar9 * 0x18;
  lVar11 = *(long *)(lVar6 + lVar7);
  lVar3 = *(long *)(lVar6 + 8 + lVar7);
  uVar5 = (long)(local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  newIndex = iVar2;
  local_248 = lVar7;
  if (lVar3 - lVar11 == uVar5) {
    local_20c = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&t,&local_20c);
    pEVar10 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    for (uVar5 = (ulong)(int)(uVar5 >> 2); lVar7 = local_248, iVar2 = newIndex,
        uVar5 < (ulong)(lVar3 - lVar11 >> 2); uVar5 = uVar5 + 1) {
      piVar4 = base_grammar::Express::operator[]((Express *)(lVar6 + local_248),(int)uVar5);
      std::vector<int,_std::allocator<int>_>::push_back(&t,piVar4);
      pEVar10 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)&pEVar10[elemIndex].expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl.super__Vector_impl_data;
      lVar11 = *(long *)(lVar6 + local_248);
      lVar3 = *(long *)(lVar6 + 8 + local_248);
    }
  }
  base_grammar::Express::Express((Express *)&local_208,&t);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar10[iVar2].expression_of_set,(value_type *)&local_208);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_208);
  iVar2 = (int)local_240;
  uVar5 = (ulong)(int)local_240;
  while (lVar9 = lVar9 + 1, lVar9 < (long)uVar5) {
    if (t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
      t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    uVar8 = (ulong)(int)((ulong)((long)(local_258->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_258->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
    lVar6 = lVar9 * 0x18;
    local_240 = lVar9;
    while( true ) {
      pEVar10 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar11 = *(long *)&pEVar10[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data;
      if ((ulong)(*(long *)(lVar11 + 8 + lVar6) - *(long *)(lVar11 + lVar6) >> 2) <= uVar8) break;
      piVar4 = base_grammar::Express::operator[]((Express *)(lVar11 + lVar6),(int)uVar8);
      std::vector<int,_std::allocator<int>_>::push_back(&t,piVar4);
      uVar8 = uVar8 + 1;
    }
    lVar6 = (long)newIndex;
    base_grammar::Express::Express((Express *)&local_1d0,&t);
    std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
              (&pEVar10[lVar6].expression_of_set,(value_type *)&local_1d0);
    lVar7 = local_248;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d0);
    lVar9 = local_240;
  }
  lVar6 = *(long *)&(this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                    super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                    ._M_impl.super__Vector_impl_data;
  if (*(long *)(lVar6 + 8 + lVar7) != *(long *)(lVar6 + lVar7)) {
    *(long *)(lVar6 + lVar7 + 8) = *(long *)(lVar6 + lVar7);
  }
  lVar6 = 0;
  uVar8 = 0;
  while( true ) {
    piVar1 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (vector<int,_std::allocator<int>_> *)
              (*(long *)&(this->elements).
                         super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                         ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data + lVar7);
    if ((ulong)((long)(local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar8) break;
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict *)((long)piVar1 + lVar6));
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 4;
  }
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&newIndex);
  local_258 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_258._4_4_,iVar2 - local_24c);
  lVar11 = (long)local_24c * 0x18;
  lVar6 = uVar5 * 0x18;
  while( true ) {
    lVar11 = lVar11 + 0x18;
    pEVar10 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pEVar10[elemIndex].expression_of_set.
                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                      ._M_impl.super__Vector_impl_data;
    if ((ulong)(((long)*(pointer *)
                        ((long)&pEVar10[elemIndex].expression_of_set.
                                super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                ._M_impl + 8) - lVar3) / 0x18) <= uVar5) break;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar3 + lVar11),
               (vector<int,_std::allocator<int>_> *)(lVar3 + lVar6));
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  iVar2 = 1;
  if (1 < (int)local_258) {
    iVar2 = (int)local_258;
  }
  while (iVar2 + -1 != 0) {
    std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::pop_back
              (&(this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set);
    iVar2 = iVar2 + -1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&t.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void GrammarLR::update_elem(int elemIndex, int begin, int end, vector<int>& factory){


    stringstream ss;
    ss << elements.size();
    int newIndex = add_elem(elements[elemIndex].name + ss.str(), false);

    //先对新的式子添加表达式,将begin到end添加的
    //产生空串的只有第一个begin有这个倾向，别的没有这个倾向,将begin单独拿出来作为特例
    vector<int> t;
    t.clear();
    if (elements[elemIndex].expression_of_set[begin].expression.size() == factory.size()){
        t.push_back(-1);
    }
    else
    {
        for (int i = factory.size(); i < elements[elemIndex].expression_of_set[begin].expression.size(); i++){
            t.push_back(elements[elemIndex].expression_of_set[begin][i]);
        }
    }
    elements[newIndex].add_expression(t);

    for (int i = begin + 1; i < end; i++){
        t.clear();
        for (int j = factory.size(); j < elements[elemIndex].expression_of_set[i].expression.size(); j++){
            t.push_back(elements[elemIndex].expression_of_set[i][j]);
        }
        elements[newIndex].add_expression(t);
    }


    //修改老元素了
    //1. 在begin下面放下结果
    elements[elemIndex].expression_of_set[begin].expression.clear();
    for (int i = 0; i < factory.size(); i++){
        elements[elemIndex].expression_of_set[begin].expression.push_back(factory[i]);
    }
    elements[elemIndex].expression_of_set[begin].expression.push_back(newIndex);

    //后面的元素提前
    int moveDistance = end - begin;
    for (int i = end; i < elements[elemIndex].expression_of_set.size(); i++){
        elements[elemIndex].expression_of_set[i - moveDistance + 1] = elements[elemIndex].expression_of_set[i];
    }

    //清楚元素，共清楚moveDistance-1个
    for (int i = 0; i < moveDistance - 1; i++){
        elements[elemIndex].expression_of_set.pop_back();
    }
}